

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O0

bool Js::VarIsCorrectType<Js::WebAssemblyMemory>(WebAssemblyMemory *obj)

{
  bool bVar1;
  WebAssemblyMemory *obj_local;
  
  bVar1 = VarIsImpl<Js::WebAssemblyMemory>((RecyclableObject *)obj);
  return bVar1;
}

Assistant:

bool VarIsCorrectType(T* obj)
    {
        return VarIsImpl<T>(obj);
    }